

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_scale_impl(ggml_context *ctx,ggml_tensor *a,float s,_Bool inplace)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  char *file;
  
  if (((a->nb[0] == type_traits[a->type].type_size) && (a->nb[2] == a->ne[1] * a->nb[1])) &&
     (a->nb[3] == a->nb[2] * a->ne[2])) {
    if (inplace) {
      pgVar1 = ggml_view_tensor(ctx,a);
    }
    else {
      pgVar1 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
    }
    if (pgVar1 != (ggml_tensor *)0x0) {
      pgVar1->op_params[0] = (int32_t)s;
      pgVar1->op = GGML_OP_SCALE;
      pgVar1->src[0] = a;
      return pgVar1;
    }
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h";
    pcVar2 = "tensor != NULL";
    line = 0x70;
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar2 = "ggml_is_padded_1d(a)";
    line = 0xb19;
  }
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

static struct ggml_tensor * ggml_scale_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 s,
        bool                  inplace) {
    GGML_ASSERT(ggml_is_padded_1d(a));

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    ggml_set_op_params(result, &s, sizeof(s));

    result->op     = GGML_OP_SCALE;
    result->src[0] = a;

    return result;
}